

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O3

void dw3_male_sage(dw_rom *rom)

{
  vpatch(rom,0x13b4,0x4f,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0,0x51,0,0x52,
         0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,
         0,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50);
  vpatch(rom,0x14b4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14d4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14f4,0xd,0x48,0,0xa9,3,0x4a,0,0xab,3,0x4c,0,0xad,3,0x4e);
  vpatch(rom,0x15b4,0x43,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,
         0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,
         0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0xb4);
  vpatch(rom,0x15fe,1,0x35);
  vpatch(rom,0x16b4,0x43,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,
         0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,
         0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0xb8);
  vpatch(rom,0x16fe,1,0x45);
  vpatch(rom,0x1705,3,0,0x39,0);
  vpatch(rom,0x1a8b,3,0x36,0x30,0x11);
  vpatch(rom,0x12300,0x80,3,0xf,0x1e,0x2d,0x11,0x2e,0x1f,0xf,3,0xf,0x1f,0x2f,0x1f,0x3b,0x12,8,0xe0,
         0xf0,0x78,0xb8,0x88,0x70,0xf8,0xf0,0xe0,0xf0,0xf8,0xf9,0xff,0xda,0x4a,0x12,0x3e,0x7f,0x67,
         0x37,0x33,0x21,0x6c,0x1f,0x37,0x37,0x3f,0x1f,0x3f,0x3f,0x73,0,0x78,0xff,0xfb,0xf8,0xf4,0xfc
         ,0x78,0,0xea,0xec,0xfc,0xfe,0xfe,0xfe,0x8a,2,3);
  vpatch(rom,0x12400,0x180,7,0xf,7,0xb,0,7,0xf,7,7,0xf,0xf,0x2f,0x3f,0x1c,0x14,0x10,0xe0,0xf8,0xf4,
         0xf8,0x7c,0x9a,0xe8,0xf4,0xe0,0xf8,0xf4,0xf8,0xfc,0xfa,0x38,0x74,4,0x1b,0x1f,0xf,7,7,3,3,
         0x17,7,7,0x1f,0x1f,0x1f,0x1f,0x10,0x60,0xf0,0xf8,0xf8,0xfc,0xf8,0xc0,0xe0,0x80,0xe0,0xf8,
         0xf8,0xfc,0xfc,0xf8,0,7);
  return;
}

Assistant:

static void dw3_male_sage(dw_rom *rom)
{
    vpatch(rom, 0x013b4,   79,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57);
    vpatch(rom, 0x014b4,   15,  0x48,  0x00,  0x49,  0x00,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x00,  0x4d,  0x00,  0x4e,  0x00,  0x4f);
    vpatch(rom, 0x014d4,   15,  0x48,  0x00,  0x49,  0x00,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x00,  0x4d,  0x00,  0x4e,  0x00,  0x4f);
    vpatch(rom, 0x014f4,   13,  0x48,  0x00,  0xa9,  0x03,  0x4a,  0x00,  0xab,  0x03,  0x4c,  0x00,  0xad,  0x03,  0x4e);
    vpatch(rom, 0x015b4,   67,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0xb4,  0x03,  0x31);
    vpatch(rom, 0x015fe,    1,  0x35);
    vpatch(rom, 0x016b4,   67,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0xb8,  0x03,  0x41);
    vpatch(rom, 0x016fe,    1,  0x45);
    vpatch(rom, 0x01705,    3,  0x00,  0x39,  0x00);
    vpatch(rom, 0x01a8b,    3,  0x36,  0x30,  0x11);
    vpatch(rom, 0x12300,  128,  0x03,  0x0f,  0x1e,  0x2d,  0x11,  0x2e,  0x1f,  0x0f,  0x03,  0x0f,  0x1f,  0x2f,  0x1f,  0x3b,  0x12,  0x08,  0xe0,  0xf0,  0x78,  0xb8,  0x88,  0x70,  0xf8,  0xf0,  0xe0,  0xf0,  0xf8,  0xf9,  0xff,  0xda,  0x4a,  0x12,  0x3e,  0x7f,  0x67,  0x37,  0x33,  0x21,  0x6c,  0x1f,  0x37,  0x37,  0x3f,  0x1f,  0x3f,  0x3f,  0x73,  0x00,  0x78,  0xff,  0xfb,  0xf8,  0xf4,  0xfc,  0x78,  0x00,  0xea,  0xec,  0xfc,  0xfe,  0xfe,  0xfe,  0x8a,  0x02,  0x03,  0x0f,  0x1e,  0x2d,  0x11,  0x2e,  0x1f,  0x0f,  0x03,  0x0f,  0x1f,  0x2f,  0x1f,  0x3b,  0x12,  0x08,  0xe0,  0xf0,  0x78,  0xb8,  0x88,  0x70,  0xf8,  0xf0,  0xe0,  0xf0,  0xf8,  0xf8,  0xf8,  0xd9,  0x4f,  0x12,  0x3e,  0x7f,  0xef,  0xd7,  0x37,  0x63,  0x1d,  0x00,  0x37,  0x37,  0x3f,  0x1f,  0x3f,  0x7f,  0x03,  0x00,  0x78,  0xfc,  0xff,  0xfb,  0xf8,  0xf4,  0xfc,  0xf8,  0xea,  0xee,  0xfc,  0xfc,  0xfe,  0xfe,  0xfe,  0x00);
    vpatch(rom, 0x12400,  384,  0x07,  0x0f,  0x07,  0x0b,  0x00,  0x07,  0x0f,  0x07,  0x07,  0x0f,  0x0f,  0x2f,  0x3f,  0x1c,  0x14,  0x10,  0xe0,  0xf8,  0xf4,  0xf8,  0x7c,  0x9a,  0xe8,  0xf4,  0xe0,  0xf8,  0xf4,  0xf8,  0xfc,  0xfa,  0x38,  0x74,  0x04,  0x1b,  0x1f,  0x0f,  0x07,  0x07,  0x03,  0x03,  0x17,  0x07,  0x07,  0x1f,  0x1f,  0x1f,  0x1f,  0x10,  0x60,  0xf0,  0xf8,  0xf8,  0xfc,  0xf8,  0xc0,  0xe0,  0x80,  0xe0,  0xf8,  0xf8,  0xfc,  0xfc,  0xf8,  0x00,  0x07,  0x0f,  0x07,  0x1b,  0x18,  0x07,  0x0f,  0x07,  0x07,  0x0f,  0x0f,  0x1f,  0x1f,  0x0c,  0x64,  0xc0,  0xe0,  0xf8,  0xf4,  0xf8,  0x7c,  0x9a,  0xe8,  0xf4,  0xe0,  0xf8,  0xf4,  0xf8,  0xfc,  0xfa,  0x38,  0x74,  0x04,  0x0b,  0x0f,  0x0f,  0x09,  0x1a,  0x11,  0x1f,  0x27,  0x1f,  0x01,  0x09,  0x0f,  0x1f,  0x1f,  0x00,  0x60,  0xf0,  0xf8,  0xf8,  0xfc,  0xf8,  0x70,  0x80,  0x80,  0xe0,  0xf8,  0xf8,  0xfc,  0xfc,  0xf8,  0xf0,  0x07,  0x1f,  0x2f,  0x1f,  0x3e,  0x59,  0x17,  0x2f,  0x07,  0x1f,  0x2f,  0x1f,  0x3f,  0x5f,  0x1c,  0x2e,  0xe0,  0xf0,  0xe0,  0xd8,  0x18,  0xe0,  0xf0,  0xe0,  0xe0,  0xf0,  0xf0,  0xfa,  0xfe,  0x34,  0x24,  0x04,  0x04,  0x0f,  0x0d,  0x0d,  0x18,  0x10,  0x10,  0x27,  0x03,  0x06,  0x0e,  0x0e,  0x1f,  0x1f,  0x1f,  0x20,  0x20,  0xc0,  0xf8,  0xf8,  0xf0,  0x18,  0x08,  0xcc,  0xe4,  0x68,  0x60,  0x30,  0x30,  0xf8,  0xb8,  0x0c,  0x07,  0x1f,  0x2f,  0x1f,  0x3e,  0x59,  0x17,  0x2f,  0x07,  0x1f,  0x2f,  0x1f,  0x3f,  0x5f,  0x1c,  0x2e,  0xe0,  0xf0,  0xe0,  0xd8,  0x18,  0xe0,  0xf0,  0xe0,  0xe0,  0xf0,  0xf0,  0xfa,  0xfe,  0x34,  0x24,  0x04,  0x04,  0x0f,  0x0f,  0x0f,  0x1f,  0x18,  0x10,  0x20,  0x03,  0x06,  0x0c,  0x0c,  0x1c,  0x1f,  0x1e,  0x20,  0x20,  0xcc,  0xbc,  0x30,  0x10,  0x18,  0x0c,  0xfc,  0xe4,  0x60,  0x60,  0xf4,  0xf4,  0xfc,  0xfc,  0x04,  0x07,  0x0f,  0x1f,  0x1f,  0x1f,  0x1f,  0x1f,  0x0f,  0x07,  0x0f,  0x1f,  0x9f,  0xff,  0x5f,  0x5f,  0x4f,  0xc0,  0xf0,  0xf8,  0xf4,  0xf8,  0xfc,  0xf8,  0xf0,  0xc0,  0xf0,  0xf8,  0xf4,  0xf8,  0xfc,  0xf8,  0xf0,  0x1b,  0xfc,  0xff,  0x7f,  0x7f,  0x3f,  0x7f,  0x3f,  0x57,  0x37,  0x7f,  0x7f,  0x7f,  0x7f,  0x7f,  0x20,  0xdc,  0x3e,  0xff,  0xfb,  0xf8,  0xf2,  0xfc,  0x00,  0xec,  0xe8,  0xfc,  0xfc,  0xfc,  0xfe,  0xc4,  0x00,  0x07,  0x0f,  0x1f,  0x1f,  0x1f,  0x1f,  0x1f,  0x0f,  0x07,  0x0f,  0x1f,  0x1f,  0x1f,  0x9f,  0xff,  0x4f,  0xc0,  0xf0,  0xf8,  0xf4,  0xf8,  0xfc,  0xf8,  0xf0,  0xc0,  0xf0,  0xf8,  0xf4,  0xf8,  0xfc,  0xf8,  0xf0,  0x1b,  0x3c,  0xff,  0xff,  0x7f,  0xff,  0x3f,  0x00,  0x57,  0x77,  0x7f,  0x7f,  0x7f,  0xff,  0x63,  0x00,  0xdc,  0x3e,  0xfe,  0xfa,  0xf8,  0xf0,  0xc2,  0xfc,  0xec,  0xee,  0xfe,  0xfe,  0xfc,  0xfc,  0xfe,  0x04);
}